

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O3

void test45(char *infile,char *password,char *outfile,char *xarg)

{
  char *__ptr;
  int iVar1;
  unsigned_long size;
  char *buf;
  unsigned_long local_28;
  char *local_20;
  
  local_20 = (char *)0x0;
  local_28 = 0;
  read_file_into_memory(xarg,&local_20,&local_28);
  iVar1 = qpdf_read(qpdf,infile,password);
  __ptr = local_20;
  if (iVar1 != 0) {
    __assert_fail("qpdf_read(qpdf, infile, password) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x50d,"void test45(const char *, const char *, const char *, const char *)");
  }
  iVar1 = qpdf_update_from_json_data(qpdf,local_20,local_28);
  if (iVar1 == 0) {
    qpdf_init_write(qpdf,outfile);
    qpdf_set_static_ID(qpdf,1);
    qpdf_write(qpdf);
    report_errors();
    free(__ptr);
    return;
  }
  __assert_fail("qpdf_update_from_json_data(qpdf, buf, size) == QPDF_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                0x50e,"void test45(const char *, const char *, const char *, const char *)");
}

Assistant:

static void
test45(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    char* buf = NULL;
    unsigned long size = 0;
    read_file_into_memory(xarg, &buf, &size);
    assert(qpdf_read(qpdf, infile, password) == 0);
    assert(qpdf_update_from_json_data(qpdf, buf, size) == QPDF_SUCCESS);
    qpdf_init_write(qpdf, outfile);
    qpdf_set_static_ID(qpdf, QPDF_TRUE);
    qpdf_write(qpdf);
    report_errors();
    free(buf);
}